

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_decompose.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  long in_RSI;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dims;
  int num_dims;
  int target_level;
  int type;
  string filename;
  ostream *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  string local_b0 [20];
  int in_stack_ffffffffffffff64;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  int local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  int local_50;
  int local_4c;
  int local_48;
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_4 = 0;
  pcVar1 = *(char **)(in_RSI + 8);
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_48 = atoi(*(char **)(local_10 + 0x10));
  local_4c = atoi(*(char **)(local_10 + 0x18));
  local_50 = atoi(*(char **)(local_10 + 0x20));
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(long)local_50;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x10a6b1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this,in_stack_ffffffffffffff28,(allocator_type *)in_stack_ffffffffffffff20);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x10a6d7);
  local_70 = 0;
  while( true ) {
    uVar3 = (ulong)local_70;
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_68);
    if (sVar4 <= uVar3) break;
    iVar2 = atoi(*(char **)(local_10 + 0x28 + (long)local_70 * 8));
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)local_70);
    *pvVar5 = (long)iVar2;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)local_70);
    in_stack_ffffffffffffff20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
    std::operator<<(in_stack_ffffffffffffff20," ");
    local_70 = local_70 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  if (local_48 == 0) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff70,local_30);
    test<float>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  }
  else {
    if (local_48 != 1) {
      std::operator<<((ostream *)&std::cerr,
                      "Only 0 (float) and 1 (double) are implemented in this test\n");
      exit(0);
    }
    std::__cxx11::string::string(local_b0,local_30);
    test<double>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    std::__cxx11::string::~string(local_b0);
  }
  local_4 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, char ** argv){
    string filename = string(argv[1]);
    int type = atoi(argv[2]); // 0 for float, 1 for double
    int target_level = atoi(argv[3]);
    const int num_dims = atoi(argv[4]);
    vector<size_t> dims(num_dims);
    for(int i=0; i<dims.size(); i++){
       dims[i] = atoi(argv[5 + i]);
       cout << dims[i] << " ";
    }
    cout << endl;
    switch(type){
        case 0:
            {
                test<float>(filename, dims, target_level);
                break;
            }
        case 1:
            {
                test<double>(filename, dims, target_level);
                break;
            }
        default:
            cerr << "Only 0 (float) and 1 (double) are implemented in this test\n";
            exit(0);
    }
    return 0;
}